

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O3

ssize_t nettlp_pcie_cfg_read(nettlp_pcie_cfg *ntpc,uint16_t addr,void *buf,size_t count)

{
  void *pvVar1;
  ssize_t sVar2;
  ulong uVar3;
  int *piVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  undefined6 in_register_00000032;
  short sVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  uint32_t data;
  byte local_7a;
  undefined1 local_79;
  uint local_78;
  uint local_74;
  int local_70;
  int local_6c;
  uint local_68;
  uint local_64;
  int local_60;
  uint local_5c;
  pollfd local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  void *local_38;
  ulong uVar12;
  
  uVar11 = (uint)CONCAT62(in_register_00000032,addr);
  uVar6 = (int)count + uVar11;
  local_74 = uVar6 & 3;
  local_48 = CONCAT62(in_register_00000032,addr) >> 2;
  uVar5 = (short)(uVar6 >> 2) - (ushort)(local_74 == 0);
  uVar6 = CONCAT22((ushort)(uVar6 >> 0x12),uVar5);
  local_50 = (ulong)uVar6;
  iVar9 = 0;
  if ((ushort)local_48 <= uVar5) {
    local_6c = 4 - local_74;
    uVar11 = uVar11 & 3;
    uVar12 = (ulong)uVar11;
    local_70 = 4 - uVar11;
    local_48 = local_48 & 0xffff;
    local_60 = (int)local_48 - uVar6;
    local_64 = (uint)((byte)(0xf << (sbyte)uVar11) & 0xe);
    local_68 = 0xfU >> ((byte)local_6c & 0x1f) & 0xff;
    iVar8 = 0;
    iVar10 = 0;
    local_40 = uVar12;
    do {
      bVar14 = uVar12 != 0;
      bVar15 = local_74 == 0;
      iVar9 = (int)local_48 + iVar8;
      sVar13 = (short)iVar8;
      bVar16 = sVar13 == 0;
      uVar6 = 0xf;
      if (bVar16 && bVar14) {
        uVar6 = local_64;
      }
      bVar17 = (short)((short)local_60 + sVar13) != 0;
      uVar11 = local_68;
      if (bVar17 || bVar15) {
        uVar11 = 0xef;
      }
      local_7a = (byte)((uint)iVar9 >> 8) & 3 | ((byte)uVar11 & (byte)uVar6) << 2;
      local_79 = (undefined1)iVar9;
      local_78 = 0;
      local_38 = buf;
      sVar2 = write(ntpc->sockfd,&local_7a,6);
      iVar9 = (int)sVar2;
      if ((int)sVar2 < 0) break;
      local_58.fd = ntpc->sockfd;
      local_58.events = 1;
      iVar9 = poll(&local_58,1,1000);
      if (iVar9 < 0) break;
      if (iVar9 == 0) {
        iVar9 = 0x3e;
LAB_001035ae:
        piVar4 = __errno_location();
        *piVar4 = iVar9;
        iVar9 = -1;
        break;
      }
      if (((byte)local_58.revents & 1) == 0) {
        iVar9 = 0x3d;
        goto LAB_001035ae;
      }
      sVar2 = read(ntpc->sockfd,&local_7a,6);
      pvVar1 = local_38;
      uVar12 = local_40;
      iVar9 = (int)sVar2;
      if ((int)sVar2 < 0) break;
      local_5c = local_78 >> 0x18 | (local_78 & 0xff0000) >> 8 | (local_78 & 0xff00) << 8 |
                 local_78 << 0x18;
      uVar3 = 0;
      if (bVar16 && bVar14) {
        uVar3 = local_40;
      }
      iVar9 = 4;
      if (bVar16 && bVar14) {
        iVar9 = local_70;
      }
      iVar7 = local_6c;
      if (bVar17 || bVar15) {
        iVar7 = 0;
      }
      iVar9 = iVar9 - iVar7;
      memcpy(local_38,(void *)((long)&local_5c + uVar3),(long)iVar9);
      buf = (void *)((long)pvVar1 + (long)iVar9);
      iVar10 = iVar10 + iVar9;
      iVar8 = iVar8 + 1;
      iVar9 = iVar10;
    } while ((ushort)((short)local_48 + sVar13 + 1U) <= (ushort)local_50);
  }
  return (long)iVar9;
}

Assistant:

ssize_t nettlp_pcie_cfg_read(struct nettlp_pcie_cfg *ntpc, uint16_t addr,
			     void *buf, size_t count)
{
	int ret;
	uint16_t dwaddr;
	uint8_t mask;
	uint32_t data;
	uint8_t *ptr;

	int len, read = 0;
	uint16_t start_dwaddr, end_dwaddr;
	int fstpad;	/* unnecessary bytes in first DWORD */
	int lstpad;	/* unnecessary bytes in last DWORD */

	fstpad = addr & 0x0003;
	lstpad = 4 - ((addr + count) & 0x0003);

	start_dwaddr = addr >> 2;
	end_dwaddr = (addr + count) >> 2;
	/* A cornor case: If (addr + count) is a multple of 4, lastpad
	 * becomes 4, which means no need to read the end dword.
	 * Thus, decrement end_dwaddr and set lstpad 0.
	 */
	if (lstpad == 4) {
		lstpad = 0;
		end_dwaddr--;
	}

	for (dwaddr = start_dwaddr; dwaddr <= end_dwaddr; dwaddr++) {

		mask = 0xF;
		if (dwaddr == start_dwaddr && fstpad) {
			mask &= ((0x0F << fstpad) & 0x0F);
		}
		if (dwaddr == end_dwaddr && lstpad) {
			mask &= ((0x0F >> lstpad) & 0x0F);
		}

		ret = pcie_cfg_read_dw(ntpc, dwaddr, mask, &data);
		if (ret < 0)
			return ret;

		len = 4;
		ptr = (uint8_t *)&data;
		if (dwaddr == start_dwaddr && fstpad) {
			len -= fstpad;
			ptr += fstpad;
		}
		if (dwaddr == end_dwaddr && lstpad) {
			len -= lstpad;
		}

		memcpy(buf, ptr, len);
		buf += len;
		read += len;
	}

	return read;
}